

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  int iVar1;
  size_t sVar2;
  undefined4 in_stack_00000020;
  size_t rowCCtxSize;
  size_t noRowCCtxSize;
  ZSTD_CCtx_params initialParams;
  undefined1 in_stack_fffffffffffffed4 [12];
  undefined8 in_stack_fffffffffffffee0;
  ZSTD_strategy ZVar3;
  undefined4 uStack_114;
  ZSTD_CCtx_params *in_stack_ffffffffffffff48;
  size_t local_8;
  
  ZVar3 = (ZSTD_strategy)&stack0x00000008;
  uStack_114 = (undefined4)((ulong)&stack0x00000008 >> 0x20);
  cParams_00._4_12_ = in_stack_fffffffffffffed4;
  cParams_00.windowLog = in_stack_00000020;
  cParams_00._16_8_ = in_stack_fffffffffffffee0;
  cParams_00.strategy = ZVar3;
  ZSTD_makeCCtxParamsFromCParams(cParams_00);
  iVar1 = ZSTD_rowMatchFinderSupported(*(ZSTD_strategy *)(CONCAT44(uStack_114,ZVar3) + 0x18));
  if (iVar1 == 0) {
    local_8 = ZSTD_estimateCStreamSize_usingCCtxParams(in_stack_ffffffffffffff48);
  }
  else {
    sVar2 = ZSTD_estimateCStreamSize_usingCCtxParams(in_stack_ffffffffffffff48);
    local_8 = ZSTD_estimateCStreamSize_usingCCtxParams(in_stack_ffffffffffffff48);
    if (local_8 < sVar2) {
      local_8 = sVar2;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params initialParams = ZSTD_makeCCtxParamsFromCParams(cParams);
    if (ZSTD_rowMatchFinderSupported(cParams.strategy)) {
        /* Pick bigger of not using and using row-based matchfinder for greedy and lazy strategies */
        size_t noRowCCtxSize;
        size_t rowCCtxSize;
        initialParams.useRowMatchFinder = ZSTD_ps_disable;
        noRowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        initialParams.useRowMatchFinder = ZSTD_ps_enable;
        rowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        return MAX(noRowCCtxSize, rowCCtxSize);
    } else {
        return ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
    }
}